

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

void __thiscall
ktx::Reporter::warning<char_const(&)[156],std::__cxx11::string,std::__cxx11::string,char_const*&>
          (Reporter *this,char (*args) [156],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,char **args_3)

{
  char *pcVar1;
  char **unaff_RBX;
  format_string<std::__cxx11::basic_string<char>_&> fmt;
  format_string<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>,_const_char_*&>
  fmt_00;
  format_string<> fmt_01;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0xc;
  ::fmt::v10::print<std::__cxx11::string&>
            ((v10 *)&std::cerr,(ostream *)"{} warning: ",fmt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_3);
  pcVar1 = (char *)strlen(*args);
  fmt_00.str_.size_ = (size_t)args_1;
  fmt_00.str_.data_ = pcVar1;
  ::fmt::v10::print<std::__cxx11::string,std::__cxx11::string,char_const*&>
            ((v10 *)&std::cerr,(ostream *)args,fmt_00,args_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_3,unaff_RBX);
  fmt_01.str_.size_ = (size_t)args_1;
  fmt_01.str_.data_ = (char *)0x1;
  ::fmt::v10::print<>((v10 *)&std::cerr,(ostream *)0x1cebe2,fmt_01);
  return;
}

Assistant:

void warning(Args&&... args) {
        fmt::print(std::cerr, "{} warning: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
    }